

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::PickerPrivate::setCurrentIndex(PickerPrivate *this,QModelIndex *mi)

{
  QAbstractItemModel *pQVar1;
  Picker *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  QModelIndex local_a0;
  QPersistentModelIndex local_88 [8];
  QModelIndex local_80;
  undefined1 local_61;
  undefined1 local_60 [7];
  bool indexChanged;
  undefined1 local_48 [16];
  quintptr local_38;
  undefined1 local_30 [8];
  QModelIndex normalized;
  QModelIndex *mi_local;
  PickerPrivate *this_local;
  
  normalized.m = (QAbstractItemModel *)mi;
  QModelIndex::QModelIndex((QModelIndex *)local_30);
  iVar3 = QModelIndex::column((QModelIndex *)normalized.m);
  if (iVar3 != this->modelColumn) {
    pQVar1 = this->model;
    iVar4 = QModelIndex::row((QModelIndex *)normalized.m);
    iVar3 = this->modelColumn;
    QModelIndex::parent((QModelIndex *)local_60,(QModelIndex *)normalized.m);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_48,pQVar1,iVar4,iVar3,local_60);
    local_30 = (undefined1  [8])local_48._0_8_;
    normalized.r = local_48._8_4_;
    normalized.c = local_48._12_4_;
    normalized.i = local_38;
  }
  bVar2 = QModelIndex::isValid((QModelIndex *)local_30);
  if (!bVar2) {
    local_30 = *(undefined1 (*) [8])normalized.m;
    normalized._0_8_ = *(undefined8 *)(normalized.m + 8);
    normalized.i = *(quintptr *)(normalized.m + 0x10);
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,&this->currentIndex);
  local_61 = QModelIndex::operator!=((QModelIndex *)local_30,&local_80);
  if ((bool)local_61) {
    QPersistentModelIndex::QPersistentModelIndex(local_88,(QModelIndex *)local_30);
    QPersistentModelIndex::operator=(&this->currentIndex,local_88);
    QPersistentModelIndex::~QPersistentModelIndex(local_88);
    QWidget::update();
    this_00 = this->q;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,&this->currentIndex);
    Picker::_q_emitCurrentIndexChanged(this_00,&local_a0);
  }
  return;
}

Assistant:

void
PickerPrivate::setCurrentIndex( const QModelIndex & mi )
{
	QModelIndex normalized;

	if( mi.column() != modelColumn )
		normalized = model->index( mi.row(), modelColumn, mi.parent() );

	if( !normalized.isValid() )
		normalized = mi;    // Fallback to passed index.

	bool indexChanged = ( normalized != currentIndex );

	if( indexChanged )
	{
		currentIndex = QPersistentModelIndex( normalized );
		q->update();
		q->_q_emitCurrentIndexChanged( currentIndex );
	}
}